

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_raw.cpp
# Opt level: O0

void __thiscall ut_raw::node_op_equal::test_method(node_op_equal *this)

{
  undefined8 uVar1;
  bool bVar2;
  node_type *pnVar3;
  lazy_ostream *plVar4;
  data_type *pdVar5;
  node_type *this_00;
  node_type *this_01;
  const_bf_iterator *pcVar6;
  pointer pnVar7;
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  *pnVar8;
  size_type sVar9;
  basic_cstring<const_char> local_1bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bc0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_1ba0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
  local_1b80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
  local_1b60;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
  local_1b40;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_1b20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1b00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_1ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ac0;
  assertion_result local_1aa0;
  basic_cstring<const_char> local_1a88;
  basic_cstring<const_char> local_1a78;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_1a68;
  const_bf_iterator local_1a10;
  const_bf_iterator local_19b8;
  const_bf_iterator local_1960;
  stringstream local_1908 [8];
  stringstream tst_5;
  ostream local_18f8 [376];
  basic_cstring<const_char> local_1780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1770;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_1750;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_1730;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_1710;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
  local_16f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_16d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_16b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_1690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1670;
  assertion_result local_1650;
  basic_cstring<const_char> local_1638;
  basic_cstring<const_char> local_1628;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_1618;
  const_bf_iterator local_15c0;
  const_bf_iterator local_1568;
  const_bf_iterator local_1510;
  stringstream local_14b8 [8];
  stringstream tst_4;
  ostream local_14a8 [376];
  basic_cstring<const_char> local_1330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1320;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_1300;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_12e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_12c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>
  local_12a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_1280;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1260;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_1240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1220;
  assertion_result local_1200;
  basic_cstring<const_char> local_11e8;
  basic_cstring<const_char> local_11d8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_11c8;
  const_bf_iterator local_1170;
  const_bf_iterator local_1118;
  const_bf_iterator local_10c0;
  stringstream local_1068 [8];
  stringstream tst_3;
  ostream local_1058 [376];
  basic_cstring<const_char> local_ee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_eb0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
  local_e90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
  local_e70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>
  local_e50;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_e30;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_e10;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  assertion_result local_db0;
  basic_cstring<const_char> local_d98;
  basic_cstring<const_char> local_d88;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_d78;
  const_bf_iterator local_d20;
  const_bf_iterator local_cc8;
  const_bf_iterator local_c70;
  stringstream local_c18 [8];
  stringstream tst_2;
  ostream local_c08 [376];
  basic_cstring<const_char> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_a60;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_a40;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_a20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>
  local_a00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_9e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_9c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  assertion_result local_960;
  basic_cstring<const_char> local_948;
  basic_cstring<const_char> local_938;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_928;
  const_bf_iterator local_8d0;
  const_bf_iterator local_878;
  const_bf_iterator local_820;
  stringstream local_7c8 [8];
  stringstream tst_1;
  ostream local_7b8 [376];
  basic_cstring<const_char> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_610;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_5f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_5d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[9],_const_char_(&)[9]>
  local_5b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[9],_const_char_(&)[9]>,_char[13],_const_char_(&)[13]>
  local_590;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[9],_const_char_(&)[9]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_570;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[9],_const_char_(&)[9]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  assertion_result local_510;
  basic_cstring<const_char> local_4f8;
  basic_cstring<const_char> local_4e8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_4d8;
  const_bf_iterator local_480;
  const_bf_iterator local_428;
  const_bf_iterator local_3d0;
  stringstream local_378 [8];
  stringstream tst;
  ostream local_368 [380];
  undefined4 local_1ec;
  size_type local_1e8;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1d0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  undefined4 local_184;
  size_type local_180;
  basic_cstring<const_char> local_178;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_168;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  undefined4 local_11c;
  basic_cstring<const_char> local_118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_108;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  data_type local_bc;
  iterator local_b8;
  data_type local_9c;
  iterator local_98;
  data_type local_7c;
  undefined1 local_78 [8];
  tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> t2;
  iterator local_58;
  data_type local_2c;
  undefined1 local_28 [8];
  tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> t1;
  node_op_equal *this_local;
  
  t1._16_8_ = this;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  local_2c = 2;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::insert
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28,
             &local_2c);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  t2._20_4_ = 3;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_58,pnVar3,(data_type *)&t2.field_0x14);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_58);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
  local_7c = 5;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::insert
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78,
             &local_7c);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  local_9c = 7;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_98,pnVar3,&local_9c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_98);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  local_bc = 0xb;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_b8,pnVar3,&local_bc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_b8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d0,0x1cd,&local_e0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_108,plVar4,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pdVar5 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar3);
    local_11c = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_108,&local_118,0x1cd,1,2,pdVar5,"t1.root().data()",&local_11c,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_108);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  this_00 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                      ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                       local_28);
  this_01 = st_tree::detail::
            node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
            ::operator[](this_00,0);
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::
  operator=(this_01,pnVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_140);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_130,0x1d0,&local_140);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_168,plVar4,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_180 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::size
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_184 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_168,&local_178,0x1d0,1,2,&local_180,"t1.size()",&local_184,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_168);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_198,0x1d1,&local_1a8);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1d0,plVar4,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_1e8 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::depth
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_1ec = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_1d0,&local_1e0,0x1d1,1,2,&local_1e8,"t1.depth()",&local_1ec,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::stringstream(local_378);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_3d0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar6,&local_3d0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_3d0);
  while( true ) {
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_428,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_428);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_428);
    if (!bVar2) break;
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_480,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_480);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_480);
    if (bVar2) {
      std::operator<<(local_368," ");
    }
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar6);
    pdVar5 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar7);
    std::ostream::operator<<(local_368,*pdVar5);
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_4d8,pcVar6);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4d8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4e8,0x1d3,&local_4f8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_530,"2 5 7 11");
    boost::test_tools::assertion_result::assertion_result(&local_510,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_610,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_5f0,&local_610,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_5d0,&local_5f0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_5b0,&local_5d0,(char (*) [9])"2 5 7 11");
    boost::unit_test::operator<<(&local_590,&local_5b0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_570,&local_590,&local_630);
    boost::unit_test::operator<<(&local_550,&local_570,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_640,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_510,&local_550,&local_640,0x1d3,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[9],_const_char_(&)[9]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_550);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[9],_const_char_(&)[9]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_570);
    std::__cxx11::string::~string((string *)&local_630);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[9],_const_char_(&)[9]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_590);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[9],_const_char_(&)[9]>
    ::~lazy_ostream_impl(&local_5b0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_5d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_5f0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_610);
    boost::test_tools::assertion_result::~assertion_result(&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_378);
  std::__cxx11::stringstream::stringstream(local_7c8);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_820,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar6,&local_820);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_820);
  while( true ) {
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_878,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_878);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_878);
    if (!bVar2) break;
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_8d0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_8d0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_8d0);
    if (bVar2) {
      std::operator<<(local_7b8," ");
    }
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar6)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::ply(pnVar8);
    std::ostream::operator<<(local_7b8,sVar9);
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_928,pcVar6);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_928);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_938,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_948);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_938,0x1d4,&local_948);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_980,"0 1 2 2");
    boost::test_tools::assertion_result::assertion_result(&local_960,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a60,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_a40,&local_a60,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_a20,&local_a40,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_a00,&local_a20,(char (*) [8])"0 1 2 2");
    boost::unit_test::operator<<(&local_9e0,&local_a00,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_9c0,&local_9e0,&local_a80);
    boost::unit_test::operator<<(&local_9a0,&local_9c0,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a90,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_960,&local_9a0,&local_a90,0x1d4,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_9a0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_9c0);
    std::__cxx11::string::~string((string *)&local_a80);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_9e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_a00);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_a20);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_a40);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_a60);
    boost::test_tools::assertion_result::~assertion_result(&local_960);
    std::__cxx11::string::~string((string *)&local_980);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_7c8);
  std::__cxx11::stringstream::stringstream(local_c18);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_c70,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar6,&local_c70);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_c70);
  while( true ) {
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_cc8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_cc8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_cc8);
    if (!bVar2) break;
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_d20,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_d20);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_d20);
    if (bVar2) {
      std::operator<<(local_c08," ");
    }
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar6)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::subtree_size(pnVar8);
    std::ostream::operator<<(local_c08,sVar9);
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_d78,pcVar6);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_d78);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d88,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d98);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d88,0x1d5,&local_d98);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_dd0,"4 3 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_db0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_eb0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_e90,&local_eb0,(char (*) [15])"subtree_size()");
    boost::unit_test::operator<<(&local_e70,&local_e90,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_e50,&local_e70,(char (*) [8])"4 3 1 1");
    boost::unit_test::operator<<(&local_e30,&local_e50,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_e10,&local_e30,&local_ed0);
    boost::unit_test::operator<<(&local_df0,&local_e10,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ee0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_db0,&local_df0,&local_ee0,0x1d5,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_df0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_e10);
    std::__cxx11::string::~string((string *)&local_ed0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_e30);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_e50);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_e70);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
    ::~lazy_ostream_impl(&local_e90);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_eb0);
    boost::test_tools::assertion_result::~assertion_result(&local_db0);
    std::__cxx11::string::~string((string *)&local_dd0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_c18);
  std::__cxx11::stringstream::stringstream(local_1068);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_10c0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
  pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar6,&local_10c0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_10c0);
  while( true ) {
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1118,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_1118);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1118);
    if (!bVar2) break;
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1170,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_1170);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1170);
    if (bVar2) {
      std::operator<<(local_1058," ");
    }
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    pnVar7 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar6);
    pdVar5 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar7);
    std::ostream::operator<<(local_1058,*pdVar5);
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_11c8,pcVar6);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_11c8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11d8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_11e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_11d8,0x1d7,&local_11e8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_1220,"5 7 11");
    boost::test_tools::assertion_result::assertion_result(&local_1200,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1300,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_12e0,&local_1300,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_12c0,&local_12e0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_12a0,&local_12c0,(char (*) [7])0x405cb7);
    boost::unit_test::operator<<(&local_1280,&local_12a0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_1260,&local_1280,&local_1320);
    boost::unit_test::operator<<(&local_1240,&local_1260,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1330,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_1200,&local_1240,&local_1330,0x1d7,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_1240);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_1260);
    std::__cxx11::string::~string((string *)&local_1320);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1280);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_12a0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_12c0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_12e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_1300);
    boost::test_tools::assertion_result::~assertion_result(&local_1200);
    std::__cxx11::string::~string((string *)&local_1220);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_1068);
  std::__cxx11::stringstream::stringstream(local_14b8);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_1510,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
  pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar6,&local_1510);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_1510);
  while( true ) {
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1568,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_1568);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1568);
    if (!bVar2) break;
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_15c0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_15c0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_15c0);
    if (bVar2) {
      std::operator<<(local_14a8," ");
    }
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    pnVar8 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar6)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::ply(pnVar8);
    std::ostream::operator<<(local_14a8,sVar9);
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_1618,pcVar6);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1618);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1628,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1638);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1628,0x1d8,&local_1638);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_1670,"0 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_1650,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1750,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_1730,&local_1750,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_1710,&local_1730,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_16f0,&local_1710,(char (*) [6])"0 1 1");
    boost::unit_test::operator<<(&local_16d0,&local_16f0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_16b0,&local_16d0,&local_1770);
    boost::unit_test::operator<<(&local_1690,&local_16b0,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1780,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_1650,&local_1690,&local_1780,0x1d8,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_1690);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_16b0);
    std::__cxx11::string::~string((string *)&local_1770);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_16d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_16f0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1710);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_1730);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_1750);
    boost::test_tools::assertion_result::~assertion_result(&local_1650);
    std::__cxx11::string::~string((string *)&local_1670);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_14b8);
  std::__cxx11::stringstream::stringstream(local_1908);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_1960,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
  pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar6,&local_1960);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_1960);
  while( true ) {
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_19b8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_19b8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_19b8);
    if (!bVar2) break;
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1a10,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar6,&local_1a10);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1a10);
    if (bVar2) {
      std::operator<<(local_18f8," ");
    }
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    pnVar8 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar6)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::subtree_size(pnVar8);
    std::ostream::operator<<(local_18f8,sVar9);
    pcVar6 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_1a68,pcVar6);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1a68);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a78,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a88);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a78,0x1d9,&local_1a88);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_1ac0,"3 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_1aa0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1ba0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_1b80,&local_1ba0,(char (*) [15])"subtree_size()");
    boost::unit_test::operator<<(&local_1b60,&local_1b80,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_1b40,&local_1b60,(char (*) [6])0x405dc0);
    boost::unit_test::operator<<(&local_1b20,&local_1b40,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_1b00,&local_1b20,&local_1bc0);
    boost::unit_test::operator<<(&local_1ae0,&local_1b00,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1bd0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_1aa0,&local_1ae0,&local_1bd0,0x1d9,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_1ae0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_1b00);
    std::__cxx11::string::~string((string *)&local_1bc0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1b20);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_1b40);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1b60);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
    ::~lazy_ostream_impl(&local_1b80);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_1ba0);
    boost::test_tools::assertion_result::~assertion_result(&local_1aa0);
    std::__cxx11::string::~string((string *)&local_1ac0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_1908);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::~tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::~tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(node_op_equal) {
    tree<int> t1;
    t1.insert(2);
    t1.root().insert(3);

    tree<int> t2;
    t2.insert(5);
    t2.root().insert(7);
    t2.root().insert(11);

    BOOST_CHECK_EQUAL(t1.root().data(), 2);

    t1.root()[0] = t2.root();
    BOOST_CHECK_EQUAL(t1.size(), 4);
    BOOST_CHECK_EQUAL(t1.depth(), 3);

    CHECK_TREE(t1, data(), "2 5 7 11");
    CHECK_TREE(t1, ply(), "0 1 2 2");
    CHECK_TREE(t1, subtree_size(), "4 3 1 1");

    CHECK_TREE(t2, data(), "5 7 11");
    CHECK_TREE(t2, ply(), "0 1 1");
    CHECK_TREE(t2, subtree_size(), "3 1 1");
}